

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O3

Transform * __thiscall
lunasvg::SVGMarkerElement::markerTransform
          (Transform *__return_storage_ptr__,SVGMarkerElement *this,Point *origin,float angle,
          float strokeWidth)

{
  Point PVar1;
  float fVar2;
  float fVar3;
  Transform viewTransform;
  Transform transform;
  LengthContext local_70;
  Transform local_60;
  Transform local_48;
  
  Transform::translated(&local_48,origin->x,origin->y);
  if ((this->m_orient).m_orientType == Angle) {
    angle = *(float *)&(this->m_orient).super_SVGProperty.field_0xc;
  }
  Transform::rotate(&local_48,angle,0.0,0.0);
  local_60.m_matrix.c._0_1_ = UserSpaceOnUse;
  local_60.m_matrix._0_8_ = this;
  fVar2 = LengthContext::valueForLength
                    ((LengthContext *)&local_60,
                     (Length *)&(this->m_markerWidth).super_SVGProperty.field_0xc,
                     (this->m_markerWidth).super_SVGProperty.field_0x9);
  fVar3 = LengthContext::valueForLength
                    ((LengthContext *)&local_60,
                     (Length *)&(this->m_markerHeight).super_SVGProperty.field_0xc,
                     (this->m_markerHeight).super_SVGProperty.field_0x9);
  local_70.m_element = (SVGElement *)CONCAT44(fVar3,fVar2);
  SVGFitToViewBox::viewBoxToViewTransform(&local_60,&this->super_SVGFitToViewBox,(Size *)&local_70);
  local_70.m_units = UserSpaceOnUse;
  local_70.m_element = &this->super_SVGElement;
  fVar2 = LengthContext::valueForLength
                    (&local_70,(Length *)&(this->m_refX).super_SVGProperty.field_0xc,
                     (this->m_refX).super_SVGProperty.field_0x9);
  fVar3 = LengthContext::valueForLength
                    (&local_70,(Length *)&(this->m_refY).super_SVGProperty.field_0xc,
                     (this->m_refY).super_SVGProperty.field_0x9);
  local_70.m_element = (SVGElement *)CONCAT44(fVar3,fVar2);
  PVar1 = Transform::mapPoint(&local_60,(Point *)&local_70);
  if ((this->m_markerUnits).super_SVGProperty.field_0x9 == '\0') {
    Transform::scale(&local_48,strokeWidth,strokeWidth);
  }
  Transform::translate(&local_48,-PVar1.x,-PVar1.y);
  Transform::operator*(__return_storage_ptr__,&local_48,&local_60);
  return __return_storage_ptr__;
}

Assistant:

Transform SVGMarkerElement::markerTransform(const Point& origin, float angle, float strokeWidth) const
{
    auto transform = Transform::translated(origin.x, origin.y);
    if(m_orient.orientType() == SVGAngle::OrientType::Angle) {
        transform.rotate(m_orient.value());
    } else {
        transform.rotate(angle);
    }

    auto viewTransform = viewBoxToViewTransform(markerSize());
    auto refOrigin = viewTransform.mapPoint(refPoint());
    if(m_markerUnits.value() == MarkerUnits::StrokeWidth)
        transform.scale(strokeWidth, strokeWidth);
    transform.translate(-refOrigin.x, -refOrigin.y);
    return transform * viewTransform;
}